

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::ReadRawBlockFromDisk
          (BlockManager *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *block,
          FlatFilePos *pos)

{
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  bool bVar1;
  AutoFile *flag;
  size_t __nbytes;
  undefined8 *in_RDX;
  size_t in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> SVar2;
  exception *e;
  uint blk_size;
  FlatFilePos hpos;
  MessageStartChars blk_start;
  AutoFile filein;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffcfc;
  FlatFilePos *in_stack_fffffffffffffd00;
  AutoFile *in_stack_fffffffffffffd08;
  array<unsigned_char,_4UL> *in_stack_fffffffffffffd10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd38;
  FlatFilePos *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  LogFlags in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  int iVar4;
  uchar *in_stack_fffffffffffffd80;
  ConstevalFormatString<2U> local_260;
  size_t in_stack_fffffffffffffdb0;
  char *pcVar5;
  char *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  bool local_1f9;
  uint local_16c;
  Level in_stack_fffffffffffffea0;
  char (*in_stack_fffffffffffffeb0) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  uint uStack_120;
  AutoFile local_118 [5];
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_120 = (uint)((ulong)*in_RDX >> 0x20);
  if (uStack_120 < 8) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    FlatFilePos::ToString_abi_cxx11_(in_stack_fffffffffffffd00);
    uVar3 = 4;
    logging_function._M_len._4_4_ = in_stack_fffffffffffffdc4;
    logging_function._M_len._0_4_ = in_stack_fffffffffffffdc0;
    logging_function._M_str = in_stack_fffffffffffffdc8;
    source_file._M_str = in_stack_fffffffffffffdb8;
    source_file._M_len = in_stack_fffffffffffffdb0;
    LogPrintFormatInternal<char[21],std::__cxx11::string>
              (logging_function,source_file,iVar4,in_stack_fffffffffffffd60,
               in_stack_fffffffffffffea0,local_260,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcfc,uVar3));
    local_1f9 = false;
  }
  else {
    iVar4 = (int)((ulong)local_118 >> 0x20);
    __nbytes = 1;
    OpenBlockFile((BlockManager *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                  in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
    bVar1 = AutoFile::IsNull((AutoFile *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
      pcVar5 = "%s: OpenBlockFile failed for %s\n";
      FlatFilePos::ToString_abi_cxx11_(in_stack_fffffffffffffd00);
      in_stack_fffffffffffffcf8 = 4;
      logging_function_00._M_len._4_4_ = in_stack_fffffffffffffdc4;
      logging_function_00._M_len._0_4_ = in_stack_fffffffffffffdc0;
      logging_function_00._M_str = pcVar5;
      source_file_00._M_str = in_stack_fffffffffffffdb8;
      source_file_00._M_len = in_stack_fffffffffffffdb0;
      LogPrintFormatInternal<char[21],std::__cxx11::string>
                (logging_function_00,source_file_00,iVar4,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffea0,local_260,in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_1f9 = false;
    }
    else {
      flag = AutoFile::operator>>
                       (in_stack_fffffffffffffd08,
                        (array<unsigned_char,_4UL> *)in_stack_fffffffffffffd00);
      AutoFile::operator>>(in_stack_fffffffffffffd08,(uint *)in_stack_fffffffffffffd00);
      GetParams((BlockManager *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      CChainParams::MessageStart
                ((CChainParams *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      bVar1 = std::operator==((array<unsigned_char,_4UL> *)in_stack_fffffffffffffd18,
                              in_stack_fffffffffffffd10);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if (local_16c < 0x2000001) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffd18,(size_type)in_stack_fffffffffffffd10);
          SVar2 = MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffd08);
          AutoFile::read(local_118,(int)SVar2.m_data,(void *)SVar2.m_size,__nbytes);
          local_1f9 = true;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          pcVar5 = 
          "%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n";
          FlatFilePos::ToString_abi_cxx11_(in_stack_fffffffffffffd00);
          in_stack_fffffffffffffcf8 = 4;
          logging_function_02._M_len._4_4_ = in_stack_fffffffffffffdc4;
          logging_function_02._M_len._0_4_ = in_stack_fffffffffffffdc0;
          logging_function_02._M_str = in_stack_fffffffffffffdc8;
          source_file_02._M_str = in_stack_fffffffffffffdb8;
          source_file_02._M_len = (size_t)pcVar5;
          LogPrintFormatInternal<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
                    (logging_function_02,source_file_02,iVar4,(LogFlags)flag,
                     in_stack_fffffffffffffea0,(ConstevalFormatString<4U>)local_260.fmt,
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                     (uint *)in_stack_fffffffffffffec0,(unsigned_long *)in_stack_fffffffffffffec8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          local_1f9 = false;
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
        pcVar5 = "%s: Block magic mismatch for %s: %s versus expected %s\n";
        FlatFilePos::ToString_abi_cxx11_(in_stack_fffffffffffffd00);
        Span<unsigned_char_const>::Span<std::array<unsigned_char,4ul>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffd08,
                   (array<unsigned_char,_4UL> *)in_stack_fffffffffffffd00,
                   (type)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        s.m_size = in_RDI;
        s.m_data = in_stack_fffffffffffffd80;
        HexStr_abi_cxx11_(s);
        GetParams((BlockManager *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        CChainParams::MessageStart
                  ((CChainParams *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        Span<unsigned_char_const>::Span<std::array<unsigned_char,4ul>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffd08,
                   (array<unsigned_char,_4UL> *)in_stack_fffffffffffffd00,
                   (type)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        s_00.m_size = in_RDI;
        s_00.m_data = in_stack_fffffffffffffd80;
        HexStr_abi_cxx11_(s_00);
        in_stack_fffffffffffffcf8 = 4;
        logging_function_01._M_len._4_4_ = in_stack_fffffffffffffdc4;
        logging_function_01._M_len._0_4_ = in_stack_fffffffffffffdc0;
        logging_function_01._M_str = in_stack_fffffffffffffdc8;
        source_file_01._M_str = pcVar5;
        source_file_01._M_len = in_stack_fffffffffffffdb0;
        LogPrintFormatInternal<char[21],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (logging_function_01,source_file_01,iVar4,(LogFlags)flag,in_stack_fffffffffffffea0
                   ,(ConstevalFormatString<4U>)local_260.fmt,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_1f9 = false;
      }
    }
    AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1f9;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadRawBlockFromDisk(std::vector<uint8_t>& block, const FlatFilePos& pos) const
{
    FlatFilePos hpos = pos;
    // If nPos is less than 8 the pos is null and we don't have the block data
    // Return early to prevent undefined behavior of unsigned int underflow
    if (hpos.nPos < 8) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }
    hpos.nPos -= 8; // Seek back 8 bytes for meta header
    AutoFile filein{OpenBlockFile(hpos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    try {
        MessageStartChars blk_start;
        unsigned int blk_size;

        filein >> blk_start >> blk_size;

        if (blk_start != GetParams().MessageStart()) {
            LogError("%s: Block magic mismatch for %s: %s versus expected %s\n", __func__, pos.ToString(),
                         HexStr(blk_start),
                         HexStr(GetParams().MessageStart()));
            return false;
        }

        if (blk_size > MAX_SIZE) {
            LogError("%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n", __func__, pos.ToString(),
                         blk_size, MAX_SIZE);
            return false;
        }

        block.resize(blk_size); // Zeroing of memory is intentional here
        filein.read(MakeWritableByteSpan(block));
    } catch (const std::exception& e) {
        LogError("%s: Read from block file failed: %s for %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    return true;
}